

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O2

optional<QJsonDocument> __thiscall QRestReply::readJson(QRestReply *this,QJsonParseError *error)

{
  bool bVar1;
  QLoggingCategory *pQVar2;
  undefined8 *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  undefined8 extraout_RDX_02;
  long in_FS_OFFSET;
  optional<QJsonDocument> oVar4;
  QJsonDocument doc;
  undefined1 local_68 [20];
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)error);
  uVar3 = extraout_RDX;
  if (bVar1) {
    bVar1 = QNetworkReply::isFinished((QNetworkReply *)error[1]);
    if (bVar1) {
      local_68._8_8_ = (char *)0xffffffff;
      local_48 = 0xaaaaaaaa;
      uStack_44 = 0xaaaaaaaa;
      local_68._16_4_ = 0xaaaaaaaa;
      uStack_54 = 0xaaaaaaaa;
      uStack_50 = 0xaaaaaaaa;
      uStack_4c = 0xaaaaaaaa;
      QIODevice::readAll();
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QJsonDocument::fromJson((QByteArray *)local_68,(QJsonParseError *)(local_68 + 0x10));
      if (in_RDX != (undefined8 *)0x0) {
        *in_RDX = local_68._8_8_;
      }
      if (local_68._12_4_ == 0) {
        std::_Optional_payload_base<QJsonDocument>::_Optional_payload_base<QJsonDocument_const>
                  ((_Optional_payload_base<QJsonDocument> *)this,local_68);
      }
      else {
        *(undefined1 *)&(this->wrapped).wp.value = 0;
      }
      QJsonDocument::~QJsonDocument((QJsonDocument *)local_68);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_68 + 0x10));
      uVar3 = extraout_RDX_01;
      goto LAB_00208cc6;
    }
    pQVar2 = QtPrivateLogging::lcQrest();
    uVar3 = extraout_RDX_00;
    if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_40 = pQVar2->name;
      local_68._16_4_ = 2;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_48 = 0;
      uStack_44 = 0;
      QMessageLogger::warning(local_68 + 0x10,"readJson() called on an unfinished reply, ignoring");
      uVar3 = extraout_RDX_02;
    }
  }
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = 0;
  }
  *(undefined1 *)&(this->wrapped).wp.value = 0;
LAB_00208cc6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  oVar4.super__Optional_base<QJsonDocument,_false,_false>._M_payload.
  super__Optional_payload<QJsonDocument,_true,_false,_false>.
  super__Optional_payload_base<QJsonDocument>._8_8_ = uVar3;
  oVar4.super__Optional_base<QJsonDocument,_false,_false>._M_payload.
  super__Optional_payload<QJsonDocument,_true,_false,_false>.
  super__Optional_payload_base<QJsonDocument>._M_payload = (_Storage<QJsonDocument,_false>)this;
  return (optional<QJsonDocument>)
         oVar4.super__Optional_base<QJsonDocument,_false,_false>._M_payload.
         super__Optional_payload<QJsonDocument,_true,_false,_false>.
         super__Optional_payload_base<QJsonDocument>;
}

Assistant:

std::optional<QJsonDocument> QRestReply::readJson(QJsonParseError *error)
{
    if (!wrapped) {
        if (error)
            *error = {0, QJsonParseError::ParseError::NoError};
        return std::nullopt;
    }

    if (!wrapped->isFinished()) {
        qCWarning(lcQrest, "readJson() called on an unfinished reply, ignoring");
        if (error)
            *error = {0, QJsonParseError::ParseError::NoError};
        return std::nullopt;
    }
    QJsonParseError parseError;
    const QByteArray data = wrapped->readAll();
    const QJsonDocument doc = QJsonDocument::fromJson(data, &parseError);
    if (error)
        *error = parseError;
    if (parseError.error)
        return std::nullopt;
    return doc;
}